

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

void __thiscall QMetaCallEvent::placeMetaCall(QMetaCallEvent *this,QObject *object)

{
  bool bVar1;
  int iVar2;
  undefined8 *in_RSI;
  QObject *in_RDI;
  QObject *in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe0;
  Call in_stack_ffffffffffffffe4;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
                     0x3ebce5);
  if (bVar1) {
    std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::operator->
              ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
               0x3ebcf9);
    QtPrivate::QSlotObjectBase::call
              ((QSlotObjectBase *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8,(void **)0x3ebd0f);
  }
  else {
    if (in_RDI[3].d_ptr.d != (QObjectData *)0x0) {
      in_stack_ffffffffffffffe4 = (Call)*(ushort *)((long)&in_RDI[4]._vptr_QObject + 4);
      (**(code **)*in_RSI)();
      iVar2 = QMetaObject::methodOffset
                        ((QMetaObject *)
                         CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      if ((int)in_stack_ffffffffffffffe4 <= iVar2) {
        (*(code *)in_RDI[3].d_ptr.d)
                  (in_RSI,0,*(undefined2 *)((long)&in_RDI[4]._vptr_QObject + 6),
                   in_RDI[3]._vptr_QObject);
        return;
      }
    }
    QMetaObject::metacall
              (in_RDI,in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0,
               &in_stack_ffffffffffffffd8->_vptr_QObject);
  }
  return;
}

Assistant:

void QMetaCallEvent::placeMetaCall(QObject *object)
{
    if (d.slotObj_) {
        d.slotObj_->call(object, d.args_);
    } else if (d.callFunction_ && d.method_offset_ <= object->metaObject()->methodOffset()) {
        d.callFunction_(object, QMetaObject::InvokeMetaMethod, d.method_relative_, d.args_);
    } else {
        QMetaObject::metacall(object, QMetaObject::InvokeMetaMethod,
                              d.method_offset_ + d.method_relative_, d.args_);
    }
}